

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_move_eol(Fl_Input *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  iVar2 = shift_position(this,iVar2);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  return (uint)!bVar1 + iVar2;
}

Assistant:

int Fl_Input::kf_move_eol() {
  return shift_position(line_end(position())) + NORMAL_INPUT_MOVE;
}